

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

string * sentencepiece::ModelProto_SentencePiece_Type_Name_abi_cxx11_
                   (ModelProto_SentencePiece_Type value)

{
  int iVar1;
  string *local_30;
  int idx;
  ModelProto_SentencePiece_Type value_local;
  
  if (ModelProto_SentencePiece_Type_Name[abi:cxx11](sentencepiece::ModelProto_SentencePiece_Type)::
      dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&ModelProto_SentencePiece_Type_Name[abi:cxx11](sentencepiece::ModelProto_SentencePiece_Type)
                                 ::dummy);
    if (iVar1 != 0) {
      ModelProto_SentencePiece_Type_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)ModelProto_SentencePiece_Type_entries,
                      (int *)ModelProto_SentencePiece_Type_entries_by_number,6,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)ModelProto_SentencePiece_Type_strings_abi_cxx11_);
      __cxa_guard_release(&ModelProto_SentencePiece_Type_Name[abi:cxx11](sentencepiece::ModelProto_SentencePiece_Type)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)ModelProto_SentencePiece_Type_entries,
                     (int *)ModelProto_SentencePiece_Type_entries_by_number,6,value);
  if (iVar1 == -1) {
    local_30 = google::protobuf::internal::GetEmptyString_abi_cxx11_();
  }
  else {
    local_30 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(ModelProto_SentencePiece_Type_strings_abi_cxx11_ + (long)iVar1 * 0x20));
  }
  return local_30;
}

Assistant:

const std::string& ModelProto_SentencePiece_Type_Name(
    ModelProto_SentencePiece_Type value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          ModelProto_SentencePiece_Type_entries,
          ModelProto_SentencePiece_Type_entries_by_number,
          6, ModelProto_SentencePiece_Type_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      ModelProto_SentencePiece_Type_entries,
      ModelProto_SentencePiece_Type_entries_by_number,
      6, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     ModelProto_SentencePiece_Type_strings[idx].get();
}